

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O0

void masc::polygon::saveSVG(string *svg_filename,c_ply *ply,obb *box)

{
  size_t *this;
  double dVar1;
  Layout layout;
  Point2d *other;
  double *pdVar2;
  double *pdVar3;
  ostream *poVar4;
  float fVar5;
  Color local_2c8;
  Stroke local_2b0;
  Fill local_288;
  undefined1 local_268 [8];
  Polygon poly_bd;
  Stroke local_1d0;
  Fill local_198;
  undefined1 local_178 [8];
  Polygon box_bd;
  Layout local_e8;
  undefined1 local_b8 [8];
  Document doc;
  Dimensions dimensions;
  Point2d center;
  float R;
  obb *box_local;
  c_ply *ply_local;
  string *svg_filename_local;
  
  fVar5 = c_ply::getRadius(ply);
  other = c_ply::getCenter(ply);
  pdVar3 = &dimensions.height;
  mathtool::Point<double,_2>::Point((Point<double,_2> *)pdVar3,other);
  svg::Dimensions::Dimensions((Dimensions *)&doc.field_0x68,(double)fVar5 * 2.5,(double)fVar5 * 2.5)
  ;
  pdVar2 = mathtool::Point<double,_2>::operator[]((Point<double,_2> *)pdVar3,0);
  dVar1 = *pdVar2;
  pdVar3 = mathtool::Point<double,_2>::operator[]((Point<double,_2> *)pdVar3,1);
  this = &box_bd.boundaries.
          super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
          ._M_impl._M_node._M_size;
  svg::Point::Point((Point *)this,(double)fVar5 * 1.25 - dVar1,(double)fVar5 * 1.25 - *pdVar3);
  svg::Layout::Layout(&local_e8,(Dimensions *)&doc.field_0x68,BottomLeft,1.0,(Point *)this);
  layout.dimensions.height = local_e8.dimensions.height;
  layout.dimensions.width = local_e8.dimensions.width;
  layout.scale = local_e8.scale;
  layout.origin = local_e8.origin;
  layout._28_4_ = local_e8._28_4_;
  layout.origin_offset.x = local_e8.origin_offset.x;
  layout.origin_offset.y = local_e8.origin_offset.y;
  svg::Document::Document((Document *)local_b8,svg_filename,layout);
  svg::Fill::Fill(&local_198,Yellow);
  svg::Color::Color((Color *)&poly_bd.boundaries.
                              super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
                              ._M_impl._M_node._M_size,Black);
  svg::Stroke::Stroke(&local_1d0,0.5,
                      (Color *)&poly_bd.boundaries.
                                super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
                                ._M_impl._M_node._M_size);
  svg::Polygon::Polygon((Polygon *)local_178,&local_198,&local_1d0);
  svg::Stroke::~Stroke(&local_1d0);
  svg::Color::~Color((Color *)&poly_bd.boundaries.
                               super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
                               ._M_impl._M_node._M_size);
  svg::Fill::~Fill(&local_198);
  box2ply(box,(Polygon *)local_178);
  svg::Document::operator<<((Document *)local_b8,(Shape *)local_178);
  svg::Fill::Fill(&local_288,Silver);
  svg::Color::Color(&local_2c8,Black);
  svg::Stroke::Stroke(&local_2b0,0.5,&local_2c8);
  svg::Polygon::Polygon((Polygon *)local_268,&local_288,&local_2b0);
  svg::Stroke::~Stroke(&local_2b0);
  svg::Color::~Color(&local_2c8);
  svg::Fill::~Fill(&local_288);
  ply2ply(ply,(Polygon *)local_268);
  svg::Document::operator<<((Document *)local_b8,(Shape *)local_268);
  svg::Document::save((Document *)local_b8);
  poVar4 = std::operator<<((ostream *)&std::cout,"- Saved ");
  poVar4 = std::operator<<(poVar4,(string *)svg_filename);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  svg::Polygon::~Polygon((Polygon *)local_268);
  svg::Polygon::~Polygon((Polygon *)local_178);
  svg::Document::~Document((Document *)local_b8);
  return;
}

Assistant:

void saveSVG(string svg_filename, masc::polygon::c_ply& ply, const masc::polygon::obb& box)
{
  //cout<<"??"<<endl;
    //create a svg file
    //char svg_filename[256];
    //sprintf(svg_filename, "%s.svg", img_name.c_str());
    auto R=ply.getRadius();
    auto center=ply.getCenter();

    //cout<<"??"<<endl;
    svg::Dimensions dimensions(R*2.5, R*2.5);
    svg::Document doc(svg_filename, svg::Layout(dimensions, svg::Layout::BottomLeft, 1, svg::Point(-center[0]+R*1.25, -center[1]+R*1.25)));

    //------------------------------------------------------------------
    //draw the external boundary
    ///cout<<"boundary"<<endl;
    svg::Polygon box_bd(svg::Fill(svg::Color::Yellow), svg::Stroke(0.5, svg::Color::Black));
    box2ply(box, box_bd);
    doc << box_bd;

//cout<<"poly"<<endl;
    svg::Polygon poly_bd(svg::Fill(svg::Color::Silver), svg::Stroke(0.5, svg::Color::Black));
    ply2ply(ply, poly_bd);
    doc << poly_bd;

    doc.save();
    cout << "- Saved " << svg_filename << endl;
}